

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_parser.c
# Opt level: O0

MPP_RET mpp_h263_parser_split(H263dParser ctx,MppPacket dst,MppPacket src)

{
  int iVar1;
  RK_U32 RVar2;
  void *pvVar3;
  size_t sVar4;
  void *__src;
  size_t sVar5;
  uint local_60;
  int local_5c;
  RK_U32 state;
  RK_S32 src_pos;
  RK_U32 src_eos;
  RK_S32 pos_frm_end;
  RK_S32 pos_frm_start;
  RK_S32 src_len;
  RK_U8 *src_buf;
  size_t dst_len;
  RK_U8 *dst_buf;
  H263dParserImpl *p;
  MPP_RET ret;
  MppPacket src_local;
  MppPacket dst_local;
  H263dParser ctx_local;
  
  p._4_4_ = MPP_NOK;
  pvVar3 = mpp_packet_get_data(dst);
  sVar4 = mpp_packet_get_length(dst);
  __src = mpp_packet_get_pos(src);
  sVar5 = mpp_packet_get_length(src);
  iVar1 = (int)sVar5;
  src_eos = *(RK_U32 *)((long)ctx + 0x28);
  src_pos = *(RK_S32 *)((long)ctx + 0x2c);
  RVar2 = mpp_packet_get_eos(src);
  local_5c = 0;
  local_60 = 0xffffffff;
  if ((h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"in\n","mpp_h263_parser_split");
  }
  if ((iVar1 == 0) &&
     (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"src_len",
                 "mpp_h263_parser_split",0x147), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (sVar4 != 0) {
    if ((sVar4 < 4) &&
       (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"dst_len >= 4",
                   "mpp_h263_parser_split",0x14a), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    local_60 = (uint)CONCAT11(*(undefined1 *)((long)pvVar3 + (sVar4 - 2)),
                              *(undefined1 *)((long)pvVar3 + (sVar4 - 1)));
  }
  if ((int)src_eos < 0) {
    for (local_5c = 0; local_5c < iVar1; local_5c = local_5c + 1) {
      local_60 = local_60 << 8 | (uint)*(byte *)((long)__src + (long)local_5c);
      if (((local_60 & 0xffff80) == 0x80) && ((*(byte *)((long)__src + (long)local_5c) & 0x7c) == 0)
         ) {
        src_eos = local_5c - 2;
        local_5c = local_5c + 1;
        break;
      }
    }
  }
  if (-1 < (int)src_eos) {
    for (; local_5c < iVar1; local_5c = local_5c + 1) {
      local_60 = local_60 << 8 | (uint)*(byte *)((long)__src + (long)local_5c);
      if (((local_60 & 0xffff80) == 0x80) && ((*(byte *)((long)__src + (long)local_5c) & 0x7c) == 0)
         ) {
        src_pos = local_5c + -2;
        break;
      }
    }
    if ((RVar2 != 0) && (local_5c == iVar1)) {
      mpp_packet_set_eos(dst);
      src_pos = iVar1;
    }
  }
  if (((int)src_eos < 0) || (src_pos < 0)) {
    memcpy((void *)((long)pvVar3 + sVar4),__src,(long)iVar1);
    mpp_packet_set_length(dst,sVar4 + (long)iVar1);
    mpp_packet_set_pos(src,(void *)((long)__src + (long)iVar1));
  }
  else {
    memcpy((void *)((long)pvVar3 + sVar4),__src,(long)src_pos);
    mpp_packet_set_length(dst,sVar4 + (long)src_pos);
    mpp_packet_set_pos(src,(void *)((long)__src + (long)src_pos));
    sVar4 = mpp_packet_get_length(src);
    if (((int)sVar4 != iVar1 - src_pos) &&
       (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,
                   "(RK_S32)mpp_packet_get_length(src) == (src_len - pos_frm_end)",
                   "mpp_h263_parser_split",0x180), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    mpp_packet_set_length(src,(long)(iVar1 - src_pos));
    p._4_4_ = MPP_OK;
    src_eos = 0xffffffff;
    src_pos = -1;
  }
  *(RK_U32 *)((long)ctx + 0x28) = src_eos;
  *(RK_S32 *)((long)ctx + 0x2c) = src_pos;
  if ((h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"out\n","mpp_h263_parser_split");
  }
  return p._4_4_;
}

Assistant:

MPP_RET mpp_h263_parser_split(H263dParser ctx, MppPacket dst, MppPacket src)
{
    MPP_RET ret = MPP_NOK;
    H263dParserImpl *p = (H263dParserImpl *)ctx;
    RK_U8 *dst_buf = mpp_packet_get_data(dst);
    size_t dst_len = mpp_packet_get_length(dst);
    RK_U8 *src_buf = mpp_packet_get_pos(src);
    RK_S32 src_len = (RK_S32)mpp_packet_get_length(src);
    RK_S32 pos_frm_start = p->pos_frm_start;
    RK_S32 pos_frm_end   = p->pos_frm_end;
    RK_U32 src_eos = mpp_packet_get_eos(src);
    RK_S32 src_pos = 0;
    RK_U32 state = (RK_U32) - 1;

    h263d_dbg_func("in\n");

    mpp_assert(src_len);

    if (dst_len) {
        mpp_assert(dst_len >= 4);
        state = ((RK_U32)(dst_buf[dst_len - 1]) <<  0) |
                ((RK_U32)(dst_buf[dst_len - 2]) <<  8) |
                ((RK_U32)(dst_buf[dst_len - 3]) << 16) |
                ((RK_U32)(dst_buf[dst_len - 4]) << 24);
    }

    if (pos_frm_start < 0) {
        // scan for frame start
        for (src_pos = 0; src_pos < src_len; src_pos++) {
            state = (state << 8) | src_buf[src_pos];
            if ((state & H263_STARTCODE_MASK) == H263_STARTCODE &&
                (state & H263_GOB_ZERO_MASK)  == H263_GOB_ZERO) {
                pos_frm_start = src_pos - 2;
                src_pos++;
                break;
            }
        }
    }

    if (pos_frm_start >= 0) {
        // scan for frame end
        for (; src_pos < src_len; src_pos++) {
            state = (state << 8) | src_buf[src_pos];

            if ((state & H263_STARTCODE_MASK) == H263_STARTCODE &&
                (state & H263_GOB_ZERO_MASK)  == H263_GOB_ZERO) {
                pos_frm_end = src_pos - 2;
                break;
            }
        }
        if (src_eos && src_pos == src_len) {
            pos_frm_end = src_len;
            mpp_packet_set_eos(dst);
        }
    }

    //mpp_log("pkt pos: start %d end %d len: left %d in %d\n",
    //        pos_frm_start, pos_frm_end, dst_len, src_len);

    if (pos_frm_start < 0 || pos_frm_end < 0) {
        // do not found frame start or do not found frame end, just copy the hold buffer to dst
        memcpy(dst_buf + dst_len, src_buf, src_len);
        // update dst buffer length
        mpp_packet_set_length(dst, dst_len + src_len);
        // set src buffer pos to end to src buffer
        mpp_packet_set_pos(src, src_buf + src_len);
    } else {
        // found both frame start and frame end - only copy frame
        memcpy(dst_buf + dst_len, src_buf, pos_frm_end);
        mpp_packet_set_length(dst, dst_len + pos_frm_end);

        // set src buffer pos to end to src buffer
        mpp_packet_set_pos(src, src_buf + pos_frm_end);
        mpp_assert((RK_S32)mpp_packet_get_length(src) == (src_len - pos_frm_end));
        mpp_packet_set_length(src, src_len - pos_frm_end);

        // return ok indicate the frame is ready and reset frame start/end position
        ret = MPP_OK;
        pos_frm_start = -1;
        pos_frm_end = -1;
    }

    p->pos_frm_start = pos_frm_start;
    p->pos_frm_end   = pos_frm_end;

    h263d_dbg_func("out\n");

    return ret;
}